

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O1

char * vrna_ptypes(short *S,vrna_md_t *md)

{
  int iVar1;
  char *pcVar2;
  int *__ptr;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint length;
  short *psVar16;
  short *psVar17;
  long lVar18;
  
  length = (uint)*S;
  if (*S < 0) {
    pcVar2 = (char *)0x0;
    vrna_message_warning
              ("vrna_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
               (ulong)length);
  }
  else {
    iVar1 = md->min_loop_size;
    pcVar2 = (char *)vrna_alloc(((length + 1) * length >> 1) + 2);
    __ptr = vrna_idx_col_wise(length);
    if (1 < (int)(length - iVar1)) {
      lVar5 = (long)(int)length;
      lVar8 = (long)(iVar1 + 2);
      piVar6 = __ptr + lVar8;
      psVar16 = S + lVar8;
      uVar11 = 1;
      do {
        psVar16 = psVar16 + 1;
        lVar18 = 1;
        piVar7 = piVar6;
        lVar9 = lVar8;
        psVar17 = psVar16;
        do {
          lVar3 = (long)iVar1 + uVar11 + lVar18;
          if (lVar3 <= lVar5) {
            lVar4 = 0;
            iVar12 = 0;
            iVar10 = 0;
            uVar15 = uVar11;
            iVar14 = md->pair[S[uVar11]][S[lVar3]];
            do {
              lVar3 = lVar9 + lVar4;
              if ((1 < (long)uVar15) && (lVar3 < lVar5)) {
                iVar10 = md->pair[S[uVar15 - 1]][psVar17[lVar4]];
              }
              iVar13 = 0;
              if (iVar12 != 0 || iVar10 != 0) {
                iVar13 = iVar14;
              }
              iVar12 = iVar13;
              if (md->noLP == 0) {
                iVar12 = iVar14;
              }
              pcVar2[piVar7[lVar4] + (int)uVar15] = (char)iVar12;
              if ((long)uVar15 < 2) break;
              uVar15 = uVar15 - 1;
              lVar4 = lVar4 + 1;
              iVar14 = iVar10;
            } while (lVar3 < lVar5);
          }
          lVar18 = lVar18 + 1;
          lVar9 = lVar9 + 1;
          piVar7 = piVar7 + 1;
          psVar17 = psVar17 + 1;
        } while (lVar18 != 3);
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 1;
        piVar6 = piVar6 + 1;
      } while (uVar11 != length - iVar1);
    }
    free(__ptr);
  }
  return pcVar2;
}

Assistant:

PUBLIC char *
vrna_ptypes(const short *S,
            vrna_md_t   *md)
{
  char  *ptype;
  int   n, i, j, k, l, *idx;
  int   min_loop_size = md->min_loop_size;

  n = S[0];

  if ((unsigned int)n > vrna_sequence_length_max(VRNA_OPTION_DEFAULT)) {
    vrna_message_warning("vrna_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                         n);
    return NULL;
  }

  ptype = (char *)vrna_alloc(sizeof(char) * ((n * (n + 1)) / 2 + 2));
  idx   = vrna_idx_col_wise(n);

  for (k = 1; k < n - min_loop_size; k++)
    for (l = 1; l <= 2; l++) {
      int type, ntype = 0, otype = 0;
      i = k;
      j = i + min_loop_size + l;
      if (j > n)
        continue;

      type = md->pair[S[i]][S[j]];
      while ((i >= 1) && (j <= n)) {
        if ((i > 1) && (j < n))
          ntype = md->pair[S[i - 1]][S[j + 1]];

        if (md->noLP && (!otype) && (!ntype))
          type = 0; /* i.j can only form isolated pairs */

        ptype[idx[j] + i] = (char)type;
        otype             = type;
        type              = ntype;
        i--;
        j++;
      }
    }
  free(idx);
  return ptype;
}